

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    CorUnix::InternalEnterCriticalSection(pThread,lpCriticalSection);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(EnterCriticalSection);
    ENTRY("EnterCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, lpCriticalSection);

    LOGEXIT("EnterCriticalSection returns void\n");
    PERF_EXIT(EnterCriticalSection);
}